

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O2

void __thiscall
ASDCP::MXF::TLVReader::TLVReader(TLVReader *this,byte_t *p,ui32_t c,IPrimerLookup *PrimerLookup)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  uint uVar3;
  ILogSink *this_00;
  ui16_t pkt_len;
  TagValue Tag;
  Result_t result;
  ui16_t local_108;
  TagValue local_106;
  undefined4 local_104;
  int local_100 [26];
  pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_> local_98 [8];
  
  Kumu::MemIOReader::MemIOReader(&this->super_MemIOReader,p,c);
  (this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_Lookup = PrimerLookup;
  Kumu::Result_t::Result_t((Result_t *)local_100,(Result_t *)&Kumu::RESULT_OK);
  do {
    while( true ) {
      if (((this->super_MemIOReader).m_capacity == (this->super_MemIOReader).m_size) ||
         (local_100[0] < 0)) {
        Kumu::Result_t::~Result_t((Result_t *)local_100);
        return;
      }
      local_108 = 0;
      bVar2 = Kumu::MemIOReader::ReadUi8(&this->super_MemIOReader,&local_106.a);
      if (bVar2) break;
LAB_00193ebc:
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(this_00,"Malformed Set\n");
      std::
      _Rb_tree<ASDCP::TagValue,_std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<ASDCP::TagValue>,_std::allocator<std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::clear(&(this->m_ElementMap)._M_t);
      local_104 = 0x1dc;
      Kumu::Result_t::operator()((int *)local_98,ASDCP::RESULT_KLV_CODING);
      Kumu::Result_t::operator=((Result_t *)local_100,(Result_t *)local_98);
      Kumu::Result_t::~Result_t((Result_t *)local_98);
    }
    bVar2 = Kumu::MemIOReader::ReadUi8(&this->super_MemIOReader,&local_106.b);
    if (!bVar2) goto LAB_00193ebc;
    bVar2 = Kumu::MemIOReader::ReadUi16BE(&this->super_MemIOReader,&local_108);
    if (!bVar2) goto LAB_00193ebc;
    local_98[0].first = local_106;
    local_98[0].second.second._0_2_ = local_108;
    local_98[0].second.first = (this->super_MemIOReader).m_size;
    local_98[0].second.second._2_2_ = 0;
    std::
    _Rb_tree<ASDCP::TagValue,std::pair<ASDCP::TagValue_const,std::pair<unsigned_int,unsigned_int>>,std::_Select1st<std::pair<ASDCP::TagValue_const,std::pair<unsigned_int,unsigned_int>>>,std::less<ASDCP::TagValue>,std::allocator<std::pair<ASDCP::TagValue_const,std::pair<unsigned_int,unsigned_int>>>>
    ::_M_insert_unique<std::pair<ASDCP::TagValue_const,std::pair<unsigned_int,unsigned_int>>>
              ((_Rb_tree<ASDCP::TagValue,std::pair<ASDCP::TagValue_const,std::pair<unsigned_int,unsigned_int>>,std::_Select1st<std::pair<ASDCP::TagValue_const,std::pair<unsigned_int,unsigned_int>>>,std::less<ASDCP::TagValue>,std::allocator<std::pair<ASDCP::TagValue_const,std::pair<unsigned_int,unsigned_int>>>>
                *)&this->m_ElementMap,local_98);
    uVar3 = (uint)local_108 + (this->super_MemIOReader).m_size;
    if ((this->super_MemIOReader).m_capacity < uVar3) goto LAB_00193ebc;
    (this->super_MemIOReader).m_size = uVar3;
  } while( true );
}

Assistant:

ASDCP::MXF::TLVReader::TLVReader(const byte_t* p, ui32_t c, IPrimerLookup* PrimerLookup) :
  MemIOReader(p, c), m_Lookup(PrimerLookup)
{
  Result_t result = RESULT_OK;

  while ( Remainder() > 0 && ASDCP_SUCCESS(result) )
    {
      TagValue Tag;
      ui16_t pkt_len = 0;

      if ( MemIOReader::ReadUi8(&Tag.a) )
	if ( MemIOReader::ReadUi8(&Tag.b) )
	  if ( MemIOReader::ReadUi16BE(&pkt_len) )
	    {
	      m_ElementMap.insert(TagMap::value_type(Tag, ItemInfo(m_size, pkt_len)));
	      if ( SkipOffset(pkt_len) )
		continue;;
	    }

      DefaultLogSink().Error("Malformed Set\n");
      m_ElementMap.clear();
      result = RESULT_KLV_CODING(__LINE__, __FILE__);
    }
}